

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

bool __thiscall OpenMD::SimInfo::removeMolecule(SimInfo *this,Molecule *mol)

{
  bool bVar1;
  size_t sVar2;
  map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  *this_00;
  Molecule *in_RSI;
  long in_RDI;
  MoleculeIterator i;
  Molecule *in_stack_00000368;
  SimInfo *in_stack_00000370;
  map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  *in_stack_ffffffffffffff98;
  _Self local_38;
  int local_2c;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_20;
  Molecule *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_20);
  local_2c = Molecule::getGlobalIndex(local_18);
  local_28 = (_Base_ptr)
             std::
             map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
             ::find(in_stack_ffffffffffffff98,(key_type *)0x1514bf);
  local_20._M_node = local_28;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::operator!=(&local_20,&local_38);
  if (bVar1) {
    sVar2 = Molecule::getNAtoms((Molecule *)0x151506);
    *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) - (int)sVar2;
    sVar2 = Molecule::getNBonds((Molecule *)0x151522);
    *(int *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) - (int)sVar2;
    sVar2 = Molecule::getNBends((Molecule *)0x15153e);
    *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) - (int)sVar2;
    sVar2 = Molecule::getNTorsions((Molecule *)0x15155a);
    *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) - (int)sVar2;
    sVar2 = Molecule::getNInversions((Molecule *)0x151576);
    *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) - (int)sVar2;
    sVar2 = Molecule::getNRigidBodies((Molecule *)0x151592);
    *(int *)(in_RDI + 0x3c) = *(int *)(in_RDI + 0x3c) - (int)sVar2;
    sVar2 = Molecule::getNIntegrableObjects((Molecule *)0x1515ae);
    *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) - (int)sVar2;
    sVar2 = Molecule::getNCutoffGroups((Molecule *)0x1515ca);
    *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) - (int)sVar2;
    sVar2 = Molecule::getNConstraintPairs((Molecule *)0x1515e6);
    *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) - (int)sVar2;
    removeInteractionPairs(in_stack_00000370,in_stack_00000368);
    this_00 = (map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
               *)(in_RDI + 0xa8);
    Molecule::getGlobalIndex(local_18);
    std::
    map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
    ::erase(this_00,(key_type *)in_stack_ffffffffffffff98);
    if (local_18 != (Molecule *)0x0) {
      (*local_18->_vptr_Molecule[1])();
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SimInfo::removeMolecule(Molecule* mol) {
    MoleculeIterator i;
    i = molecules_.find(mol->getGlobalIndex());

    if (i != molecules_.end()) {
      assert(mol == i->second);

      nAtoms_ -= mol->getNAtoms();
      nBonds_ -= mol->getNBonds();
      nBends_ -= mol->getNBends();
      nTorsions_ -= mol->getNTorsions();
      nInversions_ -= mol->getNInversions();
      nRigidBodies_ -= mol->getNRigidBodies();
      nIntegrableObjects_ -= mol->getNIntegrableObjects();
      nCutoffGroups_ -= mol->getNCutoffGroups();
      nConstraints_ -= mol->getNConstraintPairs();

      removeInteractionPairs(mol);
      molecules_.erase(mol->getGlobalIndex());

      delete mol;

      return true;
    } else {
      return false;
    }
  }